

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O2

string * pystring::translate(string *__return_storage_ptr__,string *str,string *table,
                            string *deletechars)

{
  size_type sVar1;
  pointer pcVar2;
  size_type i;
  size_type sVar3;
  long lVar4;
  size_type i_3;
  size_type sVar5;
  string s;
  int trans_table [256];
  _Alloc_hider local_458;
  size_type local_450;
  char local_448;
  undefined7 uStack_447;
  undefined8 uStack_440;
  int aiStack_438 [258];
  
  local_450 = 0;
  local_448 = '\0';
  local_458._M_p = &local_448;
  if (table->_M_string_length == 0x100) {
    sVar1 = str->_M_string_length;
    sVar5 = deletechars->_M_string_length;
    if (sVar5 == 0) {
      std::__cxx11::string::_M_assign((string *)&local_458);
      for (sVar5 = 0; sVar1 != sVar5; sVar5 = sVar5 + 1) {
        local_458._M_p[sVar5] = (table->_M_dataplus)._M_p[local_458._M_p[sVar5]];
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (local_458._M_p == &local_448) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_447,local_448);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_440;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_458._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_447,local_448);
      }
      __return_storage_ptr__->_M_string_length = local_450;
    }
    else {
      pcVar2 = (table->_M_dataplus)._M_p;
      for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
        aiStack_438[lVar4] = (int)pcVar2[lVar4];
      }
      pcVar2 = (deletechars->_M_dataplus)._M_p;
      for (sVar3 = 0; sVar5 != sVar3; sVar3 = sVar3 + 1) {
        aiStack_438[pcVar2[sVar3]] = -1;
      }
      for (sVar5 = 0; sVar1 != sVar5; sVar5 = sVar5 + 1) {
        if (aiStack_438[(str->_M_dataplus)._M_p[sVar5]] != -1) {
          std::__cxx11::string::push_back((char)&local_458);
        }
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (local_458._M_p == &local_448) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_447,local_448);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_440;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_458._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_447,local_448);
      }
      __return_storage_ptr__->_M_string_length = local_450;
    }
    local_458._M_p = &local_448;
    local_450 = 0;
    local_448 = '\0';
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  }
  std::__cxx11::string::~string((string *)&local_458);
  return __return_storage_ptr__;
}

Assistant:

std::string translate( const std::string & str, const std::string & table, const std::string & deletechars )
    {
        std::string s;
        std::string::size_type len = str.size(), dellen = deletechars.size();

        if ( table.size() != 256 )
        {
            // TODO : raise exception instead
            return str;
        }

        //if nothing is deleted, use faster code
        if ( dellen == 0 )
        {
            s = str;
            for ( std::string::size_type i = 0; i < len; ++i )
            {
                s[i] = table[ s[i] ];
            }
            return s;
        }


        int trans_table[256];
        for ( int i = 0; i < 256; i++)
        {
            trans_table[i] = table[i];
        }

        for ( std::string::size_type i = 0; i < dellen; i++)
        {
            trans_table[(int) deletechars[i] ] = -1;
        }

        for ( std::string::size_type i = 0; i < len; ++i )
        {
            if ( trans_table[ (int) str[i] ] != -1 )
            {
                s += table[ str[i] ];
            }
        }

        return s;

    }